

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void * Eigen::internal::aligned_malloc(size_t size)

{
  void *pvVar1;
  size_t in_RDI;
  void *result;
  
  check_that_malloc_is_allowed();
  pvVar1 = malloc(in_RDI);
  if ((pvVar1 == (void *)0x0) && (in_RDI != 0)) {
    throw_std_bad_alloc();
  }
  return pvVar1;
}

Assistant:

inline void* aligned_malloc(size_t size)
{
  check_that_malloc_is_allowed();

  void *result;
  #if !EIGEN_ALIGN
    result = std::malloc(size);
  #elif EIGEN_MALLOC_ALREADY_ALIGNED
    result = std::malloc(size);
  #elif EIGEN_HAS_POSIX_MEMALIGN
    if(posix_memalign(&result, 16, size)) result = 0;
  #elif EIGEN_HAS_MM_MALLOC
    result = _mm_malloc(size, 16);
  #elif defined(_MSC_VER) && (!defined(_WIN32_WCE))
    result = _aligned_malloc(size, 16);
  #else
    result = handmade_aligned_malloc(size);
  #endif

  if(!result && size)
    throw_std_bad_alloc();

  return result;
}